

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.h
# Opt level: O0

void __thiscall Assimp::ASE::Light::Light(Light *this,string *name)

{
  string *name_local;
  Light *this_local;
  
  BaseNode::BaseNode(&this->super_BaseNode,Light,name);
  *(undefined4 *)&(this->super_BaseNode).field_0x154 = 0;
  aiColor3D::aiColor3D(&this->mColor,1.0,1.0,1.0);
  this->mIntensity = 1.0;
  this->mAngle = 45.0;
  this->mFalloff = 0.0;
  return;
}

Assistant:

explicit Light(const std::string &name)
    : BaseNode   (BaseNode::Light, name)
    , mLightType (OMNI)
    , mColor     (1.f,1.f,1.f)
    , mIntensity (1.f) // light is white by default
    , mAngle     (45.f)
    , mFalloff   (0.f)
    {
    }